

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

void keymacro_print(EditLine *el,wchar_t *key)

{
  wchar_t wVar1;
  wchar_t *key_local;
  EditLine *el_local;
  
  if (((el->el_keymacro).map != (keymacro_node_t *)0x0) || (*key != L'\0')) {
    *(el->el_keymacro).buf = L'\"';
    wVar1 = node_lookup(el,key,(el->el_keymacro).map,1);
    if (0x7fffffff < (uint)wVar1) {
      fprintf((FILE *)el->el_errfile,"Unbound extended key \"%ls\"\n",key);
    }
  }
  return;
}

Assistant:

libedit_private void
keymacro_print(EditLine *el, const wchar_t *key)
{

	/* do nothing if el->el_keymacro.map is empty and null key specified */
	if (el->el_keymacro.map == NULL && *key == 0)
		return;

	el->el_keymacro.buf[0] = '"';
	if (node_lookup(el, key, el->el_keymacro.map, (size_t)1) <= -1)
		/* key is not bound */
		(void) fprintf(el->el_errfile, "Unbound extended key \"%ls"
		    "\"\n", key);
	return;
}